

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pthread.cc
# Opt level: O0

int gutil::Thread::getProcessingUnits(void)

{
  long lVar1;
  ostream *this;
  int *piVar2;
  int n;
  char *s;
  int local_14 [3];
  char *local_8;
  
  if ((anonymous_namespace)::procunits < 1) {
    lVar1 = sysconf(0x53);
    (anonymous_namespace)::procunits = (int)lVar1;
    if ((anonymous_namespace)::procunits < 1) {
      this = std::operator<<((ostream *)&std::cerr,"Cannot determine number of CPUs, assuming one!")
      ;
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
      (anonymous_namespace)::procunits = 1;
    }
    local_8 = getenv("CVKIT_MAX_THREADS");
    if (local_8 != (char *)0x0) {
      local_14[1] = 1;
      local_14[0] = atoi(local_8);
      piVar2 = std::max<int>(local_14 + 1,local_14);
      if (*piVar2 < (anonymous_namespace)::procunits) {
        (anonymous_namespace)::procunits = *piVar2;
      }
    }
  }
  return (anonymous_namespace)::procunits;
}

Assistant:

int Thread::getProcessingUnits()
{
  if (procunits <= 0)
  {
#ifdef _SC_NPROCESSORS_CONF
    procunits=sysconf(_SC_NPROCESSORS_CONF);
#endif

    if (procunits <= 0)
    {
      std::cerr << "Cannot determine number of CPUs, assuming one!" << std::endl;
      procunits=1;
    }

    const char *s=std::getenv("CVKIT_MAX_THREADS");

    if (s != 0)
    {
      int n=std::max(1, std::atoi(s));

      if (n < procunits)
      {
        procunits=n;
      }
    }
  }

  return procunits;
}